

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::html_reporter::do_params_start(html_reporter *this,parameters *params)

{
  ostream *poVar1;
  parameters *in_RSI;
  reporter *in_RDI;
  ostream *unaff_retaddr;
  parameters *in_stack_ffffffffffffffd8;
  vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
  *in_stack_ffffffffffffffe0;
  
  if (((ulong)in_RDI[1]._vptr_reporter & 0x100000000) != 0) {
    poVar1 = reporter::progress_stream(in_RDI);
    std::operator<<(poVar1,"\n\nnew parameter round\n");
    nonius::operator<<(unaff_retaddr,(parameters *)in_RDI);
  }
  std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>::
  emplace_back<>(in_stack_ffffffffffffffe0);
  std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>::back
            ((vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_> *)
             in_RSI);
  parameters::operator=(in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void do_params_start(parameters const& params) override {
            if(verbose) progress_stream() << "\n\nnew parameter round\n" << params;
            runs.emplace_back();
            runs.back().params = params;
        }